

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCl.c
# Opt level: O2

void Acec_DetectComputeSuppOne_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSupp,Vec_Int_t *vNods)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar2 = Gia_ObjId(p,pObj);
  if (piVar1[iVar2] != p->nTravIds) {
    iVar2 = Gia_ObjId(p,pObj);
    if (p->nTravIdsAlloc <= iVar2) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    iVar2 = p->nTravIds;
    piVar1 = p->pTravIds;
    iVar3 = Gia_ObjId(p,pObj);
    piVar1[iVar3] = iVar2;
    uVar4 = (uint)*(undefined8 *)pObj;
    if ((uVar4 >> 0x1e & 1) == 0) {
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acecCl.c"
                      ,0xcb,
                      "void Acec_DetectComputeSuppOne_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      Acec_DetectComputeSuppOne_rec(p,pObj + -(ulong)(uVar4 & 0x1fffffff),vSupp,vNods);
      Acec_DetectComputeSuppOne_rec
                (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vSupp,vNods);
      vSupp = vNods;
    }
    iVar2 = Gia_ObjId(p,pObj);
    Vec_IntPush(vSupp,iVar2);
    return;
  }
  return;
}

Assistant:

void Acec_DetectComputeSuppOne_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSupp, Vec_Int_t * vNods )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( pObj->fMark0 )
    {
        Vec_IntPush( vSupp, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin0(pObj), vSupp, vNods );
    Acec_DetectComputeSuppOne_rec( p, Gia_ObjFanin1(pObj), vSupp, vNods );
    Vec_IntPush( vNods, Gia_ObjId(p, pObj) );
}